

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::
make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
::operator()(make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
             *this,stringstream *msg,char *arg,duration<long,_std::ratio<1L,_1000000000L>_> args,
            char *args_1,time_point args_2,char *args_3,time_point args_4)

{
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  local_41;
  char *local_40;
  char *args_local_1;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  *this_local;
  time_point args_local_3;
  time_point args_local_2;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local;
  
  this_local = (make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
                *)args_4.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r;
  local_40 = args_1;
  args_local_1 = arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  args_local_3 = args_2;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  ::operator()(&local_41,(stringstream *)arg_local,args,local_40,args_local_3,args_3,
               (time_point)this_local);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }